

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O3

void spell_frost_breath(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  int iVar1;
  CHAR_DATA *pCVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int dam;
  CHAR_DATA *victim;
  
  act("$n breathes out a freezing cone of frost!",ch,(void *)0x0,vo,1);
  act("$n breathes a freezing cone of frost over you!",ch,(void *)0x0,vo,2);
  act("You breath out a cone of frost.",ch,(void *)0x0,(void *)0x0,3);
  iVar1 = ch->hit;
  iVar5 = dice(level,5);
  iVar5 = iVar5 + iVar1 / 9;
  if (ch->hit <= iVar5) {
    iVar5 = ch->hit;
  }
  cold_effect(*(void **)((long)vo + 0xa8),level,iVar5 / 2,2);
  victim = *(CHAR_DATA **)(*(long *)((long)vo + 0xa8) + 0x18);
  if (victim != (CHAR_DATA *)0x0) {
    iVar1 = iVar5 + 7;
    iVar3 = iVar5 + 3;
    if (-1 < iVar5) {
      iVar1 = iVar5;
      iVar3 = iVar5;
    }
    iVar6 = level + 3;
    if (-1 < level) {
      iVar6 = level;
    }
    do {
      pCVar2 = victim->next_in_room;
      bVar4 = is_safe(ch,victim);
      if (bVar4) {
        if ((victim != ch) && (victim->fighting == (CHAR_DATA *)0x0 || victim->fighting == ch)) {
LAB_002b221c:
          if (victim == (CHAR_DATA *)vo) {
            bVar4 = saves_spell(level,victim,5);
            if (bVar4) goto LAB_002b2264;
            cold_effect(victim,level,iVar5,0);
            dam = iVar5;
          }
          else {
            bVar4 = saves_spell(level + -2,victim,5);
            if (bVar4) {
              cold_effect(victim,iVar6 >> 2,iVar1 >> 3,0);
              dam = iVar3 >> 2;
            }
            else {
LAB_002b2264:
              cold_effect(victim,level / 2,iVar3 >> 2,0);
              dam = iVar5 / 2;
            }
          }
          damage_old(ch,victim,dam,sn,5,true);
        }
      }
      else if (victim != ch) goto LAB_002b221c;
      victim = pCVar2;
    } while (pCVar2 != (CHAR_DATA *)0x0);
  }
  return;
}

Assistant:

void spell_frost_breath(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	CHAR_DATA *vch, *vch_next;
	int dam, hp_dam, dice_dam, hpch;

	act("$n breathes out a freezing cone of frost!", ch, nullptr, victim, TO_NOTVICT);
	act("$n breathes a freezing cone of frost over you!", ch, nullptr, victim, TO_VICT);
	act("You breath out a cone of frost.", ch, nullptr, nullptr, TO_CHAR);

	hpch = ch->hit / 9;
	dice_dam = dice(level, 5);
	dam = hpch + dice_dam;

	if (dam > ch->hit)
		dam = ch->hit;

	hp_dam = 0;

	/*
	hpch = std::max(12,ch->hit);
	hp_dam = number_range(hpch/11 + 1, hpch/6);
	dice_dam = dice(level,16);

	dam = std::max(hp_dam + dice_dam/10,dice_dam + hp_dam/10);
	*/

	cold_effect(victim->in_room, level, dam / 2, TARGET_ROOM);

	for (vch = victim->in_room->people; vch != nullptr; vch = vch_next)
	{
		vch_next = vch->next_in_room;
		/*
		if (is_safe_spell(ch,vch,true)
			||  (is_npc(vch) && is_npc(ch) && (ch->fighting != vch || vch->fighting != ch)))
		{
			continue;
		}
		*/

		if ((is_safe(ch, vch) && vch->fighting != nullptr && vch->fighting != ch) || vch == ch)
			continue;

		if (vch == victim) /* full damage */
		{
			if (saves_spell(level, vch, DAM_COLD))
			{
				cold_effect(vch, level / 2, dam / 4, TARGET_CHAR);
				damage_old(ch, vch, dam / 2, sn, DAM_COLD, true);
			}
			else
			{
				cold_effect(vch, level, dam, TARGET_CHAR);
				damage_old(ch, vch, dam, sn, DAM_COLD, true);
			}
		}
		else
		{
			if (saves_spell(level - 2, vch, DAM_COLD))
			{
				cold_effect(vch, level / 4, dam / 8, TARGET_CHAR);
				damage_old(ch, vch, dam / 4, sn, DAM_COLD, true);
			}
			else
			{
				cold_effect(vch, level / 2, dam / 4, TARGET_CHAR);
				damage_old(ch, vch, dam / 2, sn, DAM_COLD, true);
			}
		}
	}
}